

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_points.cpp
# Opt level: O1

void __thiscall embree::Points::setNumTimeSteps(Points *this,uint numTimeSteps)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  BufferView<embree::Vec3fa> *pBVar7;
  Device *pDVar8;
  BufferView<embree::Vec3fa> *pBVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  
  uVar23 = (ulong)numTimeSteps;
  uVar22 = (this->vertices).size_alloced;
  uVar24 = uVar22;
  if ((uVar22 < uVar23) && (uVar24 = uVar23, uVar22 != 0)) {
    while (uVar24 = uVar22, uVar24 < uVar23) {
      uVar22 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0);
    }
  }
  if (uVar23 < (this->vertices).size_active) {
    if (uVar23 < (this->vertices).size_active) {
      lVar25 = uVar23 * 0x38 + 0x30;
      uVar22 = uVar23;
      do {
        plVar4 = *(long **)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar25)
        ;
        if (plVar4 != (long *)0x0) {
          (**(code **)(*plVar4 + 0x18))();
        }
        uVar22 = uVar22 + 1;
        lVar25 = lVar25 + 0x38;
      } while (uVar22 < (this->vertices).size_active);
    }
    (this->vertices).size_active = uVar23;
  }
  if ((this->vertices).size_alloced == uVar24) {
    uVar22 = (this->vertices).size_active;
    lVar25 = uVar23 - uVar22;
    if (uVar22 <= uVar23 && lVar25 != 0) {
      lVar20 = uVar22 * 0x38 + 0x30;
      do {
        pBVar5 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar5 + lVar20 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar5 + lVar20 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar5 + lVar20 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar5 + lVar20 + -8) = 1;
        *(undefined4 *)((long)pBVar5 + lVar20 + -4) = 0;
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar20) = 0;
        lVar20 = lVar20 + 0x38;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    (this->vertices).size_active = uVar23;
  }
  else {
    pDVar8 = (this->vertices).alloc.device;
    pBVar5 = (this->vertices).items;
    iVar19 = (*(pDVar8->super_State).super_RefCount._vptr_RefCount[8])(pDVar8,uVar24 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar19);
    uVar22 = (this->vertices).size_active;
    if (uVar22 != 0) {
      lVar25 = 0x30;
      uVar21 = 0;
      do {
        pBVar6 = (this->vertices).items;
        puVar2 = (undefined4 *)((long)pBVar5 + lVar25 + -0x30);
        uVar10 = *puVar2;
        uVar11 = puVar2[1];
        uVar12 = puVar2[2];
        uVar13 = puVar2[3];
        puVar1 = (undefined8 *)((long)pBVar5 + lVar25 + -0x20);
        uVar14 = *puVar1;
        uVar15 = puVar1[1];
        puVar1 = (undefined8 *)((long)pBVar5 + lVar25 + -0x10);
        uVar16 = puVar1[1];
        puVar3 = (undefined8 *)((long)pBVar6 + lVar25 + -0x10);
        *puVar3 = *puVar1;
        puVar3[1] = uVar16;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar25 + -0x20);
        *puVar1 = uVar14;
        puVar1[1] = uVar15;
        puVar2 = (undefined4 *)((long)pBVar6 + lVar25 + -0x30);
        *puVar2 = uVar10;
        puVar2[1] = uVar11;
        puVar2[2] = uVar12;
        puVar2[3] = uVar13;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar25) =
             *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar25);
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar25) = 0;
        uVar21 = uVar21 + 1;
        uVar22 = (this->vertices).size_active;
        lVar25 = lVar25 + 0x38;
      } while (uVar21 < uVar22);
    }
    lVar25 = uVar23 - uVar22;
    if (uVar22 <= uVar23 && lVar25 != 0) {
      lVar20 = uVar22 * 0x38 + 0x30;
      do {
        pBVar6 = (this->vertices).items;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar20 + -0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)pBVar6 + lVar20 + -0x30);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)pBVar6 + lVar20 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar6 + lVar20 + -8) = 1;
        *(undefined4 *)((long)pBVar6 + lVar20 + -4) = 0;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar20) = 0;
        lVar20 = lVar20 + 0x38;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    pDVar8 = (this->vertices).alloc.device;
    if (pDVar8 != (Device *)0x0) {
      (*(pDVar8->super_State).super_RefCount._vptr_RefCount[9])(pDVar8,pBVar5);
    }
    (this->vertices).size_active = uVar23;
    (this->vertices).size_alloced = uVar24;
  }
  if (*(char *)&(this->super_Geometry).field_8 == '\x1b') {
    uVar22 = (this->normals).size_alloced;
    uVar24 = uVar22;
    if ((uVar22 < uVar23) && (uVar24 = uVar23, uVar22 != 0)) {
      while (uVar24 = uVar22, uVar24 < uVar23) {
        uVar22 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0);
      }
    }
    if (uVar23 < (this->normals).size_active) {
      if (uVar23 < (this->normals).size_active) {
        lVar25 = uVar23 * 0x38 + 0x30;
        uVar22 = uVar23;
        do {
          plVar4 = *(long **)((long)&(((this->normals).items)->super_RawBufferView).ptr_ofs + lVar25
                             );
          if (plVar4 != (long *)0x0) {
            (**(code **)(*plVar4 + 0x18))();
          }
          uVar22 = uVar22 + 1;
          lVar25 = lVar25 + 0x38;
        } while (uVar22 < (this->normals).size_active);
      }
      (this->normals).size_active = uVar23;
    }
    if ((this->normals).size_alloced == uVar24) {
      uVar22 = (this->normals).size_active;
      lVar25 = uVar23 - uVar22;
      if (uVar22 <= uVar23 && lVar25 != 0) {
        lVar20 = uVar22 * 0x38 + 0x30;
        do {
          pBVar7 = (this->normals).items;
          puVar1 = (undefined8 *)((long)pBVar7 + lVar20 + -0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pBVar7 + lVar20 + -0x30);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pBVar7 + lVar20 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar7 + lVar20 + -8) = 1;
          *(undefined4 *)((long)pBVar7 + lVar20 + -4) = 0;
          *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar20) = 0;
          lVar20 = lVar20 + 0x38;
          lVar25 = lVar25 + -1;
        } while (lVar25 != 0);
      }
      (this->normals).size_active = uVar23;
    }
    else {
      pDVar8 = (this->normals).alloc.device;
      pBVar7 = (this->normals).items;
      iVar19 = (*(pDVar8->super_State).super_RefCount._vptr_RefCount[8])(pDVar8,uVar24 * 0x38,8);
      (this->normals).items = (BufferView<embree::Vec3fa> *)CONCAT44(extraout_var_00,iVar19);
      uVar22 = (this->normals).size_active;
      if (uVar22 != 0) {
        lVar25 = 0x30;
        uVar21 = 0;
        do {
          pBVar9 = (this->normals).items;
          puVar1 = (undefined8 *)((long)pBVar7 + lVar25 + -0x30);
          uVar14 = *puVar1;
          uVar15 = puVar1[1];
          puVar1 = (undefined8 *)((long)pBVar7 + lVar25 + -0x20);
          uVar16 = *puVar1;
          uVar17 = puVar1[1];
          puVar1 = (undefined8 *)((long)pBVar7 + lVar25 + -0x10);
          uVar18 = puVar1[1];
          puVar3 = (undefined8 *)((long)pBVar9 + lVar25 + -0x10);
          *puVar3 = *puVar1;
          puVar3[1] = uVar18;
          puVar1 = (undefined8 *)((long)pBVar9 + lVar25 + -0x20);
          *puVar1 = uVar16;
          puVar1[1] = uVar17;
          puVar1 = (undefined8 *)((long)pBVar9 + lVar25 + -0x30);
          *puVar1 = uVar14;
          puVar1[1] = uVar15;
          *(undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar25) =
               *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar25);
          *(undefined8 *)((long)&(pBVar7->super_RawBufferView).ptr_ofs + lVar25) = 0;
          uVar21 = uVar21 + 1;
          uVar22 = (this->normals).size_active;
          lVar25 = lVar25 + 0x38;
        } while (uVar21 < uVar22);
      }
      lVar25 = uVar23 - uVar22;
      if (uVar22 <= uVar23 && lVar25 != 0) {
        lVar20 = uVar22 * 0x38 + 0x30;
        do {
          pBVar9 = (this->normals).items;
          puVar1 = (undefined8 *)((long)pBVar9 + lVar20 + -0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pBVar9 + lVar20 + -0x30);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)pBVar9 + lVar20 + -0x10) = 0x100000000;
          *(undefined1 *)((long)pBVar9 + lVar20 + -8) = 1;
          *(undefined4 *)((long)pBVar9 + lVar20 + -4) = 0;
          *(undefined8 *)((long)&(pBVar9->super_RawBufferView).ptr_ofs + lVar20) = 0;
          lVar20 = lVar20 + 0x38;
          lVar25 = lVar25 + -1;
        } while (lVar25 != 0);
      }
      pDVar8 = (this->normals).alloc.device;
      if (pDVar8 != (Device *)0x0) {
        (*(pDVar8->super_State).super_RefCount._vptr_RefCount[9])(pDVar8,pBVar7);
      }
      (this->normals).size_active = uVar23;
      (this->normals).size_alloced = uVar24;
    }
  }
  Geometry::setNumTimeSteps(&this->super_Geometry,numTimeSteps);
  return;
}

Assistant:

void Points::setNumTimeSteps(unsigned int numTimeSteps)
  {
    vertices.resize(numTimeSteps);
    if (getType() == GTY_ORIENTED_DISC_POINT)
      normals.resize(numTimeSteps);
    Geometry::setNumTimeSteps(numTimeSteps);
  }